

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_binder.cpp
# Opt level: O2

optional_idx __thiscall
duckdb::OrderBinder::TryGetProjectionReference(OrderBinder *this,ParsedExpression *expr)

{
  ExpressionClass EVar1;
  SelectBindState *this_00;
  bool bVar2;
  ConstantExpression *pCVar3;
  int64_t iVar4;
  PositionalReferenceExpression *pPVar5;
  ColumnRefExpression *this_01;
  reference __k;
  iterator iVar6;
  const_reference pvVar7;
  ClientConfig *pCVar8;
  BinderException *this_02;
  idx_t index;
  allocator local_69;
  optional_idx local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == COLUMN_REF) {
    this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    bVar2 = ColumnRefExpression::IsQualified(this_01);
    if (!bVar2) {
      this_00 = this->bind_state;
      __k = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::get<true>(&this_01->column_names,0);
      iVar6 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00,__k);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        index = *(idx_t *)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28);
        goto LAB_006112ff;
      }
    }
  }
  else {
    if (EVar1 == POSITIONAL_REFERENCE) {
      pPVar5 = BaseExpression::Cast<duckdb::PositionalReferenceExpression>
                         (&expr->super_BaseExpression);
      index = pPVar5->index - 1;
LAB_006112ff:
      optional_idx::optional_idx(&local_68,index);
      return (optional_idx)local_68.index;
    }
    if (EVar1 == CONSTANT) {
      pCVar3 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
      bVar2 = LogicalType::IsIntegral(&(pCVar3->value).type_);
      if (bVar2) {
        iVar4 = Value::GetValue<long>(&pCVar3->value);
        index = 0x7fffffffffffffff;
        if (0 < iVar4) {
          index = iVar4 - 1;
        }
        goto LAB_006112ff;
      }
      pvVar7 = vector<std::reference_wrapper<duckdb::Binder>,_true>::get<true>(&this->binders,0);
      pCVar8 = ClientConfig::GetConfig(pvVar7->_M_data->context);
      if (pCVar8->order_by_non_integer_literal == false) {
        this_02 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,
                   "%s non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to allow this behavior."
                   ,&local_69);
        ::std::__cxx11::string::string((string *)&local_60,(string *)&this->query_component);
        BinderException::BinderException<std::__cxx11::string>(this_02,expr,&local_40,&local_60);
        __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx OrderBinder::TryGetProjectionReference(ParsedExpression &expr) const {
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::CONSTANT: {
		auto &constant = expr.Cast<ConstantExpression>();
		// ORDER BY a constant
		if (!constant.value.type().IsIntegral()) {
			// non-integral expression
			// ORDER BY <constant> has no effect
			// this is disabled by default (matching Postgres) - but we can control this with a setting
			auto &config = ClientConfig::GetConfig(binders[0].get().context);
			if (!config.order_by_non_integer_literal) {
				throw BinderException(expr,
				                      "%s non-integer literal has no effect.\n* SET "
				                      "order_by_non_integer_literal=true to allow this behavior.",
				                      query_component);
			}
			break;
		}
		// INTEGER constant: we use the integer as an index into the select list (e.g. ORDER BY 1)
		auto order_value = constant.value.GetValue<int64_t>();
		return static_cast<idx_t>(order_value <= 0 ? NumericLimits<int64_t>::Maximum() : order_value - 1);
	}
	case ExpressionClass::COLUMN_REF: {
		auto &colref = expr.Cast<ColumnRefExpression>();
		// if there is an explicit table name we can't bind to an alias
		if (colref.IsQualified()) {
			break;
		}
		// check the alias list
		auto entry = bind_state.alias_map.find(colref.column_names[0]);
		if (entry == bind_state.alias_map.end()) {
			break;
		}
		// this is an alias - return the index
		return entry->second;
	}
	case ExpressionClass::POSITIONAL_REFERENCE: {
		auto &posref = expr.Cast<PositionalReferenceExpression>();
		return posref.index - 1;
	}
	default:
		break;
	}
	return optional_idx();
}